

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra.h
# Opt level: O0

int Extra_TruthIsConst0(uint *pIn,int nVars)

{
  int local_20;
  int w;
  int nVars_local;
  uint *pIn_local;
  
  local_20 = Extra_TruthWordNum(nVars);
  do {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      return 1;
    }
  } while (pIn[local_20] == 0);
  return 0;
}

Assistant:

static inline int Extra_TruthIsConst0( unsigned * pIn, int nVars )
{
    int w;
    for ( w = Extra_TruthWordNum(nVars)-1; w >= 0; w-- )
        if ( pIn[w] )
            return 0;
    return 1;
}